

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>_>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>>>>
::
emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>>
          (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>>>>
           *this,pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>
                 *key)

{
  EntryPointer psVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  EntryPointer current_entry;
  char distance_from_desired;
  EntryPointer psVar5;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>_>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>,_bool>
  pVar6;
  hash<std::basic_string_view<char,_std::char_traits<char>_>_> local_21;
  
  sVar3 = std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                    (&local_21,&key->first);
  lVar4 = (sVar3 * -0x61c8864680b583eb >> ((byte)this[0x10] & 0x3f)) * 0x30;
  current_entry = (EntryPointer)(*(long *)this + lVar4);
  if (*(char *)(*(long *)this + lVar4) < '\0') {
    distance_from_desired = '\0';
  }
  else {
    distance_from_desired = '\0';
    psVar5 = current_entry;
    do {
      bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                        ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)this,
                         &key->first,&(psVar5->field_1).value.first);
      if (bVar2) {
        pVar6._8_8_ = 0;
        pVar6.first.current = psVar5;
        return pVar6;
      }
      current_entry = psVar5 + 1;
      distance_from_desired = distance_from_desired + '\x01';
      psVar1 = psVar5 + 1;
      psVar5 = current_entry;
    } while (distance_from_desired <= psVar1->distance_from_desired);
  }
  pVar6 = emplace_new_key<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>>
                    (this,distance_from_desired,current_entry,key);
  return pVar6;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }